

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentLexer.cxx
# Opt level: O0

yy_state_type yy_try_NUL_trans(yy_state_type yy_current_state,yyscan_t yyscanner)

{
  int local_38;
  byte local_31;
  YY_CHAR yy_c;
  char *yy_cp;
  yyguts_t_conflict1 *yyg;
  int yy_is_jam;
  yyscan_t yyscanner_local;
  yy_state_type yy_current_state_local;
  
  local_31 = 1;
  yyscanner_local._4_4_ = yy_current_state;
  if (yy_accept[yy_current_state] != 0) {
    *(yy_state_type *)((long)yyscanner + 0x70) = yy_current_state;
    *(undefined8 *)((long)yyscanner + 0x78) = *(undefined8 *)((long)yyscanner + 0x48);
  }
  while (yy_chk[(int)((int)yy_base[yyscanner_local._4_4_] + (uint)local_31)] !=
         yyscanner_local._4_4_) {
    yyscanner_local._4_4_ = (yy_state_type)yy_def[yyscanner_local._4_4_];
    if (0x1e < yyscanner_local._4_4_) {
      local_31 = ""[local_31];
    }
  }
  local_38 = (int)yy_nxt[(int)((int)yy_base[yyscanner_local._4_4_] + (uint)local_31)];
  if (local_38 == 0x1e) {
    local_38 = 0;
  }
  return local_38;
}

Assistant:

static yy_state_type yy_try_NUL_trans  (yy_state_type yy_current_state , yyscan_t yyscanner)
{
	int yy_is_jam;
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner; /* This var may be unused depending upon options. */
	char *yy_cp = yyg->yy_c_buf_p;

	YY_CHAR yy_c = 1;
	if ( yy_accept[yy_current_state] )
		{
		yyg->yy_last_accepting_state = yy_current_state;
		yyg->yy_last_accepting_cpos = yy_cp;
		}
	while ( yy_chk[yy_base[yy_current_state] + yy_c] != yy_current_state )
		{
		yy_current_state = (int) yy_def[yy_current_state];
		if ( yy_current_state >= 30 )
			yy_c = yy_meta[yy_c];
		}
	yy_current_state = yy_nxt[yy_base[yy_current_state] + yy_c];
	yy_is_jam = (yy_current_state == 29);

	(void)yyg;
	return yy_is_jam ? 0 : yy_current_state;
}